

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::NimBfbsGenerator::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Field *field)

{
  bool bVar1;
  Type *pTVar2;
  char *__s;
  int64_t iVar3;
  double dVar4;
  double dVar5;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Enum *local_40;
  Enum *type_enum;
  allocator<char> local_25;
  BaseType local_24;
  Field *pFStack_20;
  BaseType base_type;
  Field *field_local;
  NimBfbsGenerator *this_local;
  
  pFStack_20 = field;
  field_local = (Field *)this;
  this_local = (NimBfbsGenerator *)__return_storage_ptr__;
  pTVar2 = reflection::Field::type(field);
  local_24 = reflection::Type::base_type(pTVar2);
  bVar1 = anon_unknown_0::IsFloatingPoint(local_24);
  if (bVar1) {
    dVar4 = reflection::Field::default_real(pFStack_20);
    dVar5 = reflection::Field::default_real(pFStack_20);
    if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"NaN",&local_25);
      std::allocator<char>::~allocator(&local_25);
    }
    else {
      dVar4 = reflection::Field::default_real(pFStack_20);
      dVar5 = std::numeric_limits<double>::infinity();
      if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
        dVar4 = reflection::Field::default_real(pFStack_20);
        dVar5 = std::numeric_limits<double>::infinity();
        if ((dVar4 != -dVar5) || (NAN(dVar4) || NAN(-dVar5))) {
          dVar4 = reflection::Field::default_real(pFStack_20);
          NumToString<double>(__return_storage_ptr__,dVar4);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"-Inf",
                     (allocator<char> *)((long)&type_enum + 2));
          std::allocator<char>::~allocator((allocator<char> *)((long)&type_enum + 2));
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"Inf",(allocator<char> *)((long)&type_enum + 3))
        ;
        std::allocator<char>::~allocator((allocator<char> *)((long)&type_enum + 3));
      }
    }
  }
  else {
    bVar1 = anon_unknown_0::IsBool(local_24);
    if (bVar1) {
      iVar3 = reflection::Field::default_integer(pFStack_20);
      __s = "false";
      if (iVar3 != 0) {
        __s = "true";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)((long)&type_enum + 1));
      std::allocator<char>::~allocator((allocator<char> *)((long)&type_enum + 1));
    }
    else {
      bVar1 = IsScalar(local_24);
      if (bVar1) {
        pTVar2 = reflection::Field::type(pFStack_20);
        local_40 = BaseBfbsGenerator::GetEnum((BaseBfbsGenerator *)this,pTVar2,false);
        if (local_40 == (Enum *)0x0) {
          iVar3 = reflection::Field::default_integer(pFStack_20);
          NumToString<long>(__return_storage_ptr__,iVar3);
        }
        else {
          iVar3 = reflection::Field::default_integer(pFStack_20);
          NumToString<long>(&local_80,iVar3);
          std::operator+(&local_60,"type(result)(",&local_80);
          std::operator+(__return_storage_ptr__,&local_60,")");
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
        }
      }
      else if (local_24 == String) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"\"\"",&local_81);
        std::allocator<char>::~allocator(&local_81);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"0",&local_82);
        std::allocator<char>::~allocator(&local_82);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const r::Field *field) const {
    const r::BaseType base_type = field->type()->base_type();
    if (IsFloatingPoint(base_type)) {
      if (field->default_real() != field->default_real()) {
        return "NaN";
      } else if (field->default_real() ==
                 std::numeric_limits<double>::infinity()) {
        return "Inf";
      } else if (field->default_real() ==
                 -std::numeric_limits<double>::infinity()) {
        return "-Inf";
      }
      return NumToString(field->default_real());
    }
    if (IsBool(base_type)) {
      return field->default_integer() ? "true" : "false";
    }
    if (IsScalar(base_type)) {
      const r::Enum *type_enum = GetEnum(field->type());
      if (type_enum != nullptr) {
        return "type(result)(" + NumToString((field->default_integer())) + ")";
      }
      return NumToString((field->default_integer()));
    }
    if (base_type == r::String) { return "\"\""; }
    // represents offsets
    return "0";
  }